

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O0

void __thiscall
IndexFromCommand::IndexFromCommand
          (IndexFromCommand *this,string *path_list_fname,
          vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,bool ensure_unique)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  vector<IndexType,_std::allocator<IndexType>_> *unaff_retaddr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  string *__x;
  
  psVar1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT71(in_register_00000009,in_CL);
  __x = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (unaff_retaddr,(vector<IndexType,_std::allocator<IndexType>_> *)__x);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_RDI,psVar1);
  in_RDI[0x68] = (string)(in_R8B & 1);
  return;
}

Assistant:

IndexFromCommand(const std::string &path_list_fname,
                     const std::vector<IndexType> &types,
                     std::set<std::string> taints, bool ensure_unique)
        : path_list_fname_(path_list_fname),
          types_(types),
          taints_(taints),
          ensure_unique_(ensure_unique) {}